

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_v_predictor_16x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  ushort uVar7;
  undefined1 auVar8 [15];
  unkuint9 Var9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [13];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  undefined1 auVar32 [16];
  ushort uVar33;
  ushort uVar34;
  short sVar35;
  ushort uVar37;
  ushort uVar38;
  short sVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  undefined1 auVar36 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  short sVar54;
  short sVar59;
  short sVar62;
  short sVar65;
  short sVar68;
  short sVar71;
  short sVar74;
  undefined1 auVar57 [16];
  ushort uVar55;
  ushort uVar56;
  ushort uVar60;
  ushort uVar61;
  ushort uVar63;
  ushort uVar64;
  ushort uVar66;
  ushort uVar67;
  ushort uVar69;
  ushort uVar70;
  ushort uVar72;
  ushort uVar73;
  ushort uVar75;
  ushort uVar76;
  short sVar77;
  ushort uVar78;
  ushort uVar79;
  undefined1 auVar58 [16];
  
  auVar58 = _DAT_00516040;
  auVar15 = pshuflw(ZEXT116(left_column[0x1f]),ZEXT116(left_column[0x1f]),0);
  sVar35 = auVar15._0_2_;
  sVar39 = auVar15._2_2_;
  auVar53._2_2_ = sVar39 * 0x10;
  auVar53._0_2_ = sVar35;
  auVar53._4_2_ = sVar35 * 0x1f;
  auVar53._6_2_ = sVar39 * 0x2e;
  auVar53._8_2_ = sVar35 * 0x3c;
  auVar53._10_2_ = sVar39 * 0x4a;
  auVar53._12_2_ = sVar35 * 0x57;
  auVar53._14_2_ = sVar39 * 99;
  auVar36._0_2_ = sVar35 * 0xbe;
  auVar36._2_2_ = sVar39 * 0xc5;
  auVar36._4_2_ = sVar35 * 0xcc;
  auVar36._6_2_ = sVar39 * 0xd3;
  auVar36._8_2_ = sVar35 * 0xd9;
  auVar36._10_2_ = sVar39 * 0xde;
  auVar36._12_2_ = sVar35 * 0xe3;
  auVar36._14_2_ = sVar39 * 0xe7;
  auVar15 = *(undefined1 (*) [16])top_row;
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar15._0_13_;
  auVar1[0xe] = auVar15[7];
  auVar2[0xc] = auVar15[6];
  auVar2._0_12_ = auVar15._0_12_;
  auVar2._13_2_ = auVar1._13_2_;
  auVar3[0xb] = 0;
  auVar3._0_11_ = auVar15._0_11_;
  auVar3._12_3_ = auVar2._12_3_;
  auVar4[10] = auVar15[5];
  auVar4._0_10_ = auVar15._0_10_;
  auVar4._11_4_ = auVar3._11_4_;
  auVar5[9] = 0;
  auVar5._0_9_ = auVar15._0_9_;
  auVar5._10_5_ = auVar4._10_5_;
  auVar6[8] = auVar15[4];
  auVar6._0_8_ = auVar15._0_8_;
  auVar6._9_6_ = auVar5._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar6._8_7_;
  Var9 = CONCAT81(SUB158(auVar8 << 0x40,7),auVar15[3]);
  auVar12._9_6_ = 0;
  auVar12._0_9_ = Var9;
  auVar10._1_10_ = SUB1510(auVar12 << 0x30,5);
  auVar10[0] = auVar15[2];
  auVar13._11_4_ = 0;
  auVar13._0_11_ = auVar10;
  auVar11._1_12_ = SUB1512(auVar13 << 0x20,3);
  auVar11[0] = auVar15[1];
  uVar25 = (ushort)auVar15[0];
  uVar17 = (ushort)auVar15[8];
  uVar14 = 0xfefdfefe;
  do {
    uVar14 = uVar14 + 0x2020202;
    auVar57._4_4_ = uVar14;
    auVar57._0_4_ = uVar14;
    auVar57._8_4_ = uVar14;
    auVar57._12_4_ = uVar14;
    auVar52 = pshufb(auVar58,auVar57);
    auVar57 = pshufb(auVar53,auVar57);
    sVar26 = auVar11._0_2_;
    sVar27 = auVar10._0_2_;
    sVar28 = (short)Var9;
    sVar29 = auVar6._8_2_;
    sVar30 = auVar4._10_2_;
    sVar31 = auVar2._12_2_;
    uVar7 = auVar1._13_2_ >> 8;
    uVar18 = (ushort)auVar15[9];
    uVar19 = (ushort)auVar15[10];
    uVar20 = (ushort)auVar15[0xb];
    uVar21 = (ushort)auVar15[0xc];
    uVar22 = (ushort)auVar15[0xd];
    uVar23 = (ushort)auVar15[0xe];
    uVar24 = (ushort)auVar15[0xf];
    sVar54 = auVar57._0_2_ + 0x80;
    sVar59 = auVar57._2_2_ + 0x80;
    sVar62 = auVar57._4_2_ + 0x80;
    sVar65 = auVar57._6_2_ + 0x80;
    sVar68 = auVar57._8_2_ + 0x80;
    sVar71 = auVar57._10_2_ + 0x80;
    sVar74 = auVar57._12_2_ + 0x80;
    sVar77 = auVar57._14_2_ + 0x80;
    uVar33 = auVar52._0_2_ * uVar25 + sVar54;
    uVar37 = auVar52._2_2_ * sVar26 + sVar59;
    uVar40 = auVar52._4_2_ * sVar27 + sVar62;
    uVar42 = auVar52._6_2_ * sVar28 + sVar65;
    uVar44 = auVar52._8_2_ * sVar29 + sVar68;
    uVar46 = auVar52._10_2_ * sVar30 + sVar71;
    uVar48 = auVar52._12_2_ * sVar31 + sVar74;
    uVar50 = auVar52._14_2_ * uVar7 + sVar77;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    uVar49 = uVar48 >> 8;
    uVar51 = uVar50 >> 8;
    uVar55 = sVar54 + auVar52._0_2_ * uVar17;
    uVar60 = sVar59 + auVar52._2_2_ * uVar18;
    uVar63 = sVar62 + auVar52._4_2_ * uVar19;
    uVar66 = sVar65 + auVar52._6_2_ * uVar20;
    uVar69 = sVar68 + auVar52._8_2_ * uVar21;
    uVar72 = sVar71 + auVar52._10_2_ * uVar22;
    uVar75 = sVar74 + auVar52._12_2_ * uVar23;
    uVar78 = sVar77 + auVar52._14_2_ * uVar24;
    uVar56 = uVar55 >> 8;
    uVar61 = uVar60 >> 8;
    uVar64 = uVar63 >> 8;
    uVar67 = uVar66 >> 8;
    uVar70 = uVar69 >> 8;
    uVar73 = uVar72 >> 8;
    uVar76 = uVar75 >> 8;
    uVar79 = uVar78 >> 8;
    *dst = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
    dst[1] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
    dst[2] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
    dst[3] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
    dst[4] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
    dst[5] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
    dst[6] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
    dst[7] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
    dst[8] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    dst[9] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
    dst[10] = (uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar63 >> 8) - (0xff < uVar64);
    dst[0xb] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67);
    dst[0xc] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
    dst[0xd] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
    dst[0xe] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    dst[0xf] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    auVar57 = _DAT_00516060;
    dst = dst + stride;
  } while (uVar14 < 0xd0c0d0d);
  auVar15._0_2_ = sVar35 * 0x6f;
  auVar15._2_2_ = sVar39 * 0x7b;
  auVar15._4_2_ = sVar35 * 0x86;
  auVar15._6_2_ = sVar39 * 0x91;
  auVar15._8_2_ = sVar35 * 0x9b;
  auVar15._10_2_ = sVar39 * 0xa4;
  auVar15._12_2_ = sVar35 * 0xad;
  auVar15._14_2_ = sVar39 * 0xb6;
  uVar14 = 0xfefdfefe;
  do {
    uVar14 = uVar14 + 0x2020202;
    auVar58._4_4_ = uVar14;
    auVar58._0_4_ = uVar14;
    auVar58._8_4_ = uVar14;
    auVar58._12_4_ = uVar14;
    auVar53 = pshufb(auVar57,auVar58);
    auVar58 = pshufb(auVar15,auVar58);
    sVar54 = auVar58._0_2_ + 0x80;
    sVar59 = auVar58._2_2_ + 0x80;
    sVar62 = auVar58._4_2_ + 0x80;
    sVar65 = auVar58._6_2_ + 0x80;
    sVar68 = auVar58._8_2_ + 0x80;
    sVar71 = auVar58._10_2_ + 0x80;
    sVar74 = auVar58._12_2_ + 0x80;
    sVar77 = auVar58._14_2_ + 0x80;
    uVar33 = auVar53._0_2_ * uVar25 + sVar54;
    uVar37 = auVar53._2_2_ * sVar26 + sVar59;
    uVar40 = auVar53._4_2_ * sVar27 + sVar62;
    uVar42 = auVar53._6_2_ * sVar28 + sVar65;
    uVar44 = auVar53._8_2_ * sVar29 + sVar68;
    uVar46 = auVar53._10_2_ * sVar30 + sVar71;
    uVar48 = auVar53._12_2_ * sVar31 + sVar74;
    uVar50 = auVar53._14_2_ * uVar7 + sVar77;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    uVar49 = uVar48 >> 8;
    uVar51 = uVar50 >> 8;
    uVar55 = sVar54 + auVar53._0_2_ * uVar17;
    uVar60 = sVar59 + auVar53._2_2_ * uVar18;
    uVar63 = sVar62 + auVar53._4_2_ * uVar19;
    uVar66 = sVar65 + auVar53._6_2_ * uVar20;
    uVar69 = sVar68 + auVar53._8_2_ * uVar21;
    uVar72 = sVar71 + auVar53._10_2_ * uVar22;
    uVar75 = sVar74 + auVar53._12_2_ * uVar23;
    uVar78 = sVar77 + auVar53._14_2_ * uVar24;
    uVar56 = uVar55 >> 8;
    uVar61 = uVar60 >> 8;
    uVar64 = uVar63 >> 8;
    uVar67 = uVar66 >> 8;
    uVar70 = uVar69 >> 8;
    uVar73 = uVar72 >> 8;
    uVar76 = uVar75 >> 8;
    uVar79 = uVar78 >> 8;
    *dst = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
    dst[1] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
    dst[2] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
    dst[3] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
    dst[4] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
    dst[5] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
    dst[6] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
    dst[7] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
    dst[8] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    dst[9] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
    dst[10] = (uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar63 >> 8) - (0xff < uVar64);
    dst[0xb] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67);
    dst[0xc] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
    dst[0xd] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
    dst[0xe] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    dst[0xf] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    auVar58 = _DAT_00516080;
    dst = dst + stride;
  } while (uVar14 < 0xd0c0d0d);
  uVar14 = 0xfefdfefe;
  do {
    uVar14 = uVar14 + 0x2020202;
    auVar52._4_4_ = uVar14;
    auVar52._0_4_ = uVar14;
    auVar52._8_4_ = uVar14;
    auVar52._12_4_ = uVar14;
    auVar15 = pshufb(auVar58,auVar52);
    auVar53 = pshufb(auVar36,auVar52);
    sVar54 = auVar53._0_2_ + 0x80;
    sVar59 = auVar53._2_2_ + 0x80;
    sVar62 = auVar53._4_2_ + 0x80;
    sVar65 = auVar53._6_2_ + 0x80;
    sVar68 = auVar53._8_2_ + 0x80;
    sVar71 = auVar53._10_2_ + 0x80;
    sVar74 = auVar53._12_2_ + 0x80;
    sVar77 = auVar53._14_2_ + 0x80;
    uVar33 = auVar15._0_2_ * uVar25 + sVar54;
    uVar37 = auVar15._2_2_ * sVar26 + sVar59;
    uVar40 = auVar15._4_2_ * sVar27 + sVar62;
    uVar42 = auVar15._6_2_ * sVar28 + sVar65;
    uVar44 = auVar15._8_2_ * sVar29 + sVar68;
    uVar46 = auVar15._10_2_ * sVar30 + sVar71;
    uVar48 = auVar15._12_2_ * sVar31 + sVar74;
    uVar50 = auVar15._14_2_ * uVar7 + sVar77;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    uVar49 = uVar48 >> 8;
    uVar51 = uVar50 >> 8;
    uVar55 = sVar54 + auVar15._0_2_ * uVar17;
    uVar60 = sVar59 + auVar15._2_2_ * uVar18;
    uVar63 = sVar62 + auVar15._4_2_ * uVar19;
    uVar66 = sVar65 + auVar15._6_2_ * uVar20;
    uVar69 = sVar68 + auVar15._8_2_ * uVar21;
    uVar72 = sVar71 + auVar15._10_2_ * uVar22;
    uVar75 = sVar74 + auVar15._12_2_ * uVar23;
    uVar78 = sVar77 + auVar15._14_2_ * uVar24;
    uVar56 = uVar55 >> 8;
    uVar61 = uVar60 >> 8;
    uVar64 = uVar63 >> 8;
    uVar67 = uVar66 >> 8;
    uVar70 = uVar69 >> 8;
    uVar73 = uVar72 >> 8;
    uVar76 = uVar75 >> 8;
    uVar79 = uVar78 >> 8;
    *dst = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
    dst[1] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
    dst[2] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
    dst[3] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
    dst[4] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
    dst[5] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
    dst[6] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
    dst[7] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
    dst[8] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    dst[9] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
    dst[10] = (uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar63 >> 8) - (0xff < uVar64);
    dst[0xb] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67);
    dst[0xc] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
    dst[0xd] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
    dst[0xe] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    dst[0xf] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    auVar15 = _DAT_005160a0;
    dst = dst + stride;
  } while (uVar14 < 0xd0c0d0d);
  auVar16._0_2_ = sVar35 * 0xeb;
  auVar16._2_2_ = sVar39 * 0xef;
  auVar16._4_2_ = sVar35 * 0xf2;
  auVar16._6_2_ = sVar39 * 0xf4;
  auVar16._8_2_ = sVar35 * 0xf6;
  auVar16._10_2_ = sVar39 * 0xf7;
  auVar16._12_2_ = sVar35 * 0xf8;
  auVar16._14_2_ = sVar39 * 0xf8;
  uVar14 = 0xfefdfefe;
  do {
    uVar14 = uVar14 + 0x2020202;
    auVar32._4_4_ = uVar14;
    auVar32._0_4_ = uVar14;
    auVar32._8_4_ = uVar14;
    auVar32._12_4_ = uVar14;
    auVar58 = pshufb(auVar15,auVar32);
    auVar36 = pshufb(auVar16,auVar32);
    sVar35 = auVar36._0_2_ + 0x80;
    sVar39 = auVar36._2_2_ + 0x80;
    sVar54 = auVar36._4_2_ + 0x80;
    sVar59 = auVar36._6_2_ + 0x80;
    sVar62 = auVar36._8_2_ + 0x80;
    sVar65 = auVar36._10_2_ + 0x80;
    sVar68 = auVar36._12_2_ + 0x80;
    sVar71 = auVar36._14_2_ + 0x80;
    uVar33 = auVar58._0_2_ * uVar25 + sVar35;
    uVar37 = auVar58._2_2_ * sVar26 + sVar39;
    uVar40 = auVar58._4_2_ * sVar27 + sVar54;
    uVar42 = auVar58._6_2_ * sVar28 + sVar59;
    uVar44 = auVar58._8_2_ * sVar29 + sVar62;
    uVar46 = auVar58._10_2_ * sVar30 + sVar65;
    uVar48 = auVar58._12_2_ * sVar31 + sVar68;
    uVar50 = auVar58._14_2_ * uVar7 + sVar71;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    uVar49 = uVar48 >> 8;
    uVar51 = uVar50 >> 8;
    uVar55 = sVar35 + auVar58._0_2_ * uVar17;
    uVar60 = sVar39 + auVar58._2_2_ * uVar18;
    uVar63 = sVar54 + auVar58._4_2_ * uVar19;
    uVar66 = sVar59 + auVar58._6_2_ * uVar20;
    uVar69 = sVar62 + auVar58._8_2_ * uVar21;
    uVar72 = sVar65 + auVar58._10_2_ * uVar22;
    uVar75 = sVar68 + auVar58._12_2_ * uVar23;
    uVar78 = sVar71 + auVar58._14_2_ * uVar24;
    uVar56 = uVar55 >> 8;
    uVar61 = uVar60 >> 8;
    uVar64 = uVar63 >> 8;
    uVar67 = uVar66 >> 8;
    uVar70 = uVar69 >> 8;
    uVar73 = uVar72 >> 8;
    uVar76 = uVar75 >> 8;
    uVar79 = uVar78 >> 8;
    *dst = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
    dst[1] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
    dst[2] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
    dst[3] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
    dst[4] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
    dst[5] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
    dst[6] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
    dst[7] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
    dst[8] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    dst[9] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
    dst[10] = (uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar63 >> 8) - (0xff < uVar64);
    dst[0xb] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67);
    dst[0xc] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
    dst[0xd] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
    dst[0xe] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    dst[0xf] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    dst = dst + stride;
  } while (uVar14 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_v_predictor_16x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i zero = _mm_setzero_si128();
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = _mm_unpackhi_epi8(weights_lo, zero);
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = _mm_unpackhi_epi8(weights_hi, zero);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i scaled_bottom_left3 =
      _mm_mullo_epi16(inverted_weights3, bottom_left);
  const __m128i scaled_bottom_left4 =
      _mm_mullo_epi16(inverted_weights4, bottom_left);
  const __m128i round = _mm_set1_epi16(128);

  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = _mm_unpackhi_epi8(top, zero);
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights3, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left3, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights4, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left4, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}